

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O1

nng_err nng_pipe_close(nng_pipe p)

{
  nng_err nVar1;
  nni_pipe *local_10;
  nni_pipe *pipe;
  
  nVar1 = nni_pipe_find(&local_10,p.id);
  if (nVar1 == NNG_OK) {
    nni_pipe_close(local_10);
    nni_pipe_rele(local_10);
    nVar1 = NNG_OK;
  }
  return nVar1;
}

Assistant:

nng_err
nng_pipe_close(nng_pipe p)
{
	nng_err   rv;
	nni_pipe *pipe;

	if ((rv = nni_pipe_find(&pipe, p.id)) != 0) {
		return (rv);
	}
	nni_pipe_close(pipe);
	nni_pipe_rele(pipe);
	return (NNG_OK);
}